

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

bool __thiscall
SharedMemRingBuffer::CommitRead(SharedMemRingBuffer *this,size_t user_id,int64_t index)

{
  __int_type_conflict in_RDI;
  
  std::__atomic_base<long>::operator=((__atomic_base<long> *)index,in_RDI);
  return true;
}

Assistant:

bool  SharedMemRingBuffer::CommitRead(size_t user_id, int64_t index)
{
    ring_buffer_status_on_shared_mem_->array_consumer_indexes[user_id] = index ; //update

#if 0
    char szMsg[100];
    snprintf(szMsg, sizeof(szMsg), 
            "[id:%d]     \t\t\t\t\t\t\t\t\t\t\t\t[%s-%d] index[%" PRId64 "] ", user_id, __func__, __LINE__, index );
    {AtomicPrint atomicPrint(szMsg);}
#endif
    return true;
}